

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  char **ppcVar1;
  undefined1 *puVar2;
  char **ppcVar3;
  char **ppcVar4;
  char **passwordp;
  ushort uVar5;
  hsts *h;
  curl_slist *pcVar6;
  curl_trc_feat *pcVar7;
  altsvcinfo *asi;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  void *pvVar11;
  undefined4 uVar12;
  _Bool _Var13;
  http_majors hVar14;
  byte bVar15;
  CURLUcode CVar16;
  int iVar17;
  CURLcode CVar18;
  NETRCcode ret;
  uint uVar19;
  CURLcode CVar20;
  connectdata *conn;
  ulong uVar21;
  char *pcVar22;
  CURLU *u;
  size_t sVar23;
  size_t sVar24;
  stsentry *psVar25;
  Curl_handler *pCVar26;
  ulong uVar27;
  byte *pbVar28;
  char *pcVar29;
  long lVar30;
  timediff_t tVar31;
  Curl_dns_entry *pCVar32;
  Curl_addrinfo *pCVar33;
  byte bVar34;
  ConnectBits CVar35;
  byte bVar36;
  ulong uVar37;
  byte *__s;
  char *pcVar38;
  byte *pbVar39;
  char **ppcVar40;
  connectdata *conn_00;
  char *pcVar41;
  hostname *host;
  byte *pbVar42;
  bool bVar43;
  curltime cVar44;
  curltime newer;
  curltime older;
  curl_slist **local_b8;
  char *local_b0;
  char *newurl;
  Curl_easy *pCStack_90;
  connectdata *local_88;
  undefined8 uStack_80;
  curl_proxytype local_74;
  hostname *local_70;
  char *local_68;
  _Bool *local_60;
  proxy_info *local_58;
  undefined8 local_50;
  char *local_48;
  _Bool *local_40;
  char *local_38;
  
  *asyncp = false;
  Curl_req_hard_reset(&data->req,data);
  *asyncp = false;
  if ((data->state).url == (char *)0x0) {
    return CURLE_URL_MALFORMAT;
  }
  conn = (connectdata *)(*Curl_ccalloc)(1,0x5c0);
  if (conn == (connectdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  conn->sock[0] = -1;
  conn->sock[1] = -1;
  conn->sockfd = -1;
  conn->writesockfd = -1;
  conn->connection_id = -1;
  (conn->primary).remote_port = -1;
  conn->remote_port = -1;
  CVar18 = CURLE_UNSUPPORTED_PROTOCOL;
  Curl_conncontrol(conn,1);
  cVar44 = Curl_now();
  (conn->created).tv_sec = cVar44.tv_sec;
  (conn->created).tv_usec = cVar44.tv_usec;
  (conn->keepalive).tv_sec = (conn->created).tv_sec;
  (conn->keepalive).tv_usec = (conn->created).tv_usec;
  *(undefined4 *)&(conn->keepalive).field_0xc = *(undefined4 *)&(conn->created).field_0xc;
  bVar15 = (data->set).proxytype;
  (conn->http_proxy).proxytype = bVar15;
  (conn->socks_proxy).proxytype = '\x04';
  pcVar22 = (data->set).str[0x26];
  if ((pcVar22 == (char *)0x0) || (*pcVar22 == '\0')) {
    uVar21 = 0;
    uVar27 = 0;
    uVar37 = 0;
  }
  else {
    uVar27 = 0x10;
    uVar21 = (ulong)(bVar15 < 4);
    uVar37 = (ulong)((uint)(bVar15 >= 4) * 2);
  }
  CVar35 = (ConnectBits)((ulong)conn->bits & 0xffffffffffffffec | uVar21 | uVar27 | uVar37);
  conn->bits = CVar35;
  pcVar22 = (data->set).str[0x27];
  if ((pcVar22 != (char *)0x0) && (*pcVar22 != '\0')) {
    CVar35 = (ConnectBits)((ulong)CVar35 | 0x12);
    conn->bits = CVar35;
  }
  CVar35 = (ConnectBits)
           (((ulong)CVar35 & 0xfffffffffffffffb) +
           (ulong)((data->state).aptr.proxyuser != (char *)0x0) * 4);
  conn->bits = CVar35;
  uVar27 = (ulong)(*(uint *)&(data->set).field_0x89c >> 8 & 8);
  conn->bits = (ConnectBits)((ulong)CVar35 & 0xfffffffffffffff7 | uVar27);
  uVar21 = (ulong)(*(uint *)&(data->set).field_0x89c >> 1 & 0x8000);
  conn->bits = (ConnectBits)((ulong)CVar35 & 0xffffffffffff7ff7 | uVar27 | uVar21);
  conn->bits = (ConnectBits)
               ((ulong)CVar35 & 0xfffffffffffe7ff7 | uVar27 | uVar21 |
               (ulong)(*(uint *)&(data->set).field_0x89c >> 1 & 0x10000));
  conn->ip_version = (data->set).ipver;
  conn->connect_only = (data->set).field_0x89c & 1;
  conn->transport = '\x03';
  Curl_uint_spbset_init(&conn->xfers_attached);
  pcVar22 = (data->set).str[0x1e];
  if (pcVar22 != (char *)0x0) {
    pcVar22 = (*Curl_cstrdup)(pcVar22);
    conn->localdev = pcVar22;
    if (pcVar22 == (char *)0x0) {
      (*Curl_cfree)((void *)0x0);
      (*Curl_cfree)(conn);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  conn->localportrange = (data->set).localportrange;
  conn->localport = (data->set).localport;
  pvVar11 = (data->set).closesocket_client;
  conn->fclosesocket = (data->set).fclosesocket;
  conn->closesocket_client = pvVar11;
  iVar17 = (conn->created).tv_usec;
  uVar12 = *(undefined4 *)&(conn->created).field_0xc;
  (conn->lastused).tv_sec = (conn->created).tv_sec;
  (conn->lastused).tv_usec = iVar17;
  *(undefined4 *)&(conn->lastused).field_0xc = uVar12;
  local_40 = protocol_done;
  Curl_hash_init(&conn->meta_hash,0x17,Curl_hash_str,Curl_str_key_compare,conn_meta_freeentry);
  if ((data->set).uh == (CURLU *)0x0) {
    bVar43 = false;
  }
  else {
    bVar43 = ((data->state).field_0x7be & 8) == 0;
  }
  local_60 = asyncp;
  up_free(data);
  if (bVar43) {
    u = curl_url_dup((data->set).uh);
  }
  else {
    u = curl_url();
  }
  (data->state).uh = u;
  CVar20 = CURLE_OUT_OF_MEMORY;
  if (u == (CURLU *)0x0) goto switchD_0015cad1_caseD_5;
  if (((data->set).str[0x1d] != (char *)0x0) &&
     (sVar23 = Curl_is_absolute_url((data->state).url,(char *)0x0,0,true), sVar23 == 0)) {
    pcVar22 = curl_maprintf("%s://%s",(data->set).str[0x1d],(data->state).url);
    if (pcVar22 != (char *)0x0) {
      uVar19 = *(uint *)&(data->state).field_0x7be;
      if ((uVar19 >> 0x10 & 1) != 0) {
        (*Curl_cfree)((data->state).url);
        uVar19 = *(uint *)&(data->state).field_0x7be;
      }
      (data->state).url = pcVar22;
      *(uint *)&(data->state).field_0x7be = uVar19 | 0x10000;
      goto LAB_0015ca92;
    }
    goto switchD_0015cad1_caseD_7;
  }
LAB_0015ca92:
  if (!bVar43) {
    uVar19 = (uint)((ulong)*(undefined8 *)&(data->set).field_0x89c >> 0x20);
    CVar16 = curl_url_set(u,CURLUPART_URL,(data->state).url,
                          (uVar19 >> 0xc & 0x20) + (uVar19 >> 7 & 0x10) + 0x208);
    if (CVar16 == CURLUE_OK) {
      CVar16 = curl_url_get(u,CURLUPART_URL,&newurl,0);
      CVar20 = CURLE_URL_MALFORMAT;
      switch(CVar16) {
      case CURLUE_OK:
        uVar19 = *(uint *)&(data->state).field_0x7be;
        if ((uVar19 >> 0x10 & 1) != 0) {
          (*Curl_cfree)((data->state).url);
          uVar19 = *(uint *)&(data->state).field_0x7be;
        }
        (data->state).url = newurl;
        *(uint *)&(data->state).field_0x7be = uVar19 | 0x10000;
        goto LAB_0015ca9b;
      default:
        goto switchD_0015cad1_caseD_5;
      case CURLUE_UNSUPPORTED_SCHEME:
        goto switchD_0015cbca_caseD_5;
      case CURLUE_OUT_OF_MEMORY:
        goto switchD_0015cad1_caseD_7;
      case CURLUE_USER_NOT_ALLOWED:
        goto switchD_0015cad1_caseD_8;
      }
    }
    pcVar22 = curl_url_strerror(CVar16);
    Curl_failf(data,"URL rejected: %s",pcVar22);
    if (CVar16 - CURLUE_UNSUPPORTED_SCHEME < 4) {
      CVar20 = *(CURLcode *)(&DAT_0017db4c + (ulong)(CVar16 - CURLUE_UNSUPPORTED_SCHEME) * 4);
      goto switchD_0015cad1_caseD_5;
    }
    goto switchD_0015cf66_caseD_1;
  }
LAB_0015ca9b:
  part = &(data->state).up;
  CVar20 = CURLE_UNSUPPORTED_PROTOCOL;
  CVar16 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
  switch(CVar16) {
  case CURLUE_OK:
    ppcVar1 = &(data->state).up.hostname;
    CVar16 = curl_url_get(u,CURLUPART_HOST,ppcVar1,0);
    if (CVar16 == CURLUE_OK) {
      pcVar22 = *ppcVar1;
      sVar24 = strlen(pcVar22);
      if (0xffff < sVar24) {
        Curl_failf(data,"Too long hostname (maximum is %d)",0xffff);
        goto switchD_0015cad1_caseD_1;
      }
LAB_0015cc3b:
      if (pcVar22 == (char *)0x0) {
        pcVar41 = (char *)0x0;
      }
      else {
        pcVar41 = pcVar22;
        if (*pcVar22 == '[') {
          puVar2 = &(conn->bits).field_0x1;
          *puVar2 = *puVar2 | 4;
          pcVar41 = pcVar22 + 1;
          sVar24 = strlen(pcVar41);
          pcVar22[sVar24] = '\0';
          zonefrom_url(u,data,conn);
        }
      }
      local_48 = "";
      if (pcVar41 == (char *)0x0) {
        pcVar41 = "";
      }
      pcVar22 = (*Curl_cstrdup)(pcVar41);
      (conn->host).rawalloc = pcVar22;
      if (pcVar22 == (char *)0x0) goto switchD_0015cad1_caseD_7;
      host = &conn->host;
      (conn->host).name = pcVar22;
      CVar18 = Curl_idnconvert_hostname(host);
      if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
      if ((data->hsts != (hsts *)0x0) && (iVar17 = curl_strequal("http",part->scheme), iVar17 != 0))
      {
        h = data->hsts;
        pcVar22 = (conn->host).name;
        local_70 = host;
        sVar24 = strlen(pcVar22);
        host = local_70;
        psVar25 = Curl_hsts(h,pcVar22,sVar24,true);
        if (psVar25 != (stsentry *)0x0) {
          (*Curl_cfree)(part->scheme);
          part->scheme = (char *)0x0;
          CVar16 = curl_url_set(u,CURLUPART_SCHEME,"https",0);
          CVar18 = CURLE_URL_MALFORMAT;
          switch(CVar16) {
          case CURLUE_OK:
            if (((data->state).field_0x7c0 & 1) != 0) {
              (*Curl_cfree)((data->state).url);
              (data->state).url = (char *)0x0;
            }
            CVar16 = curl_url_get(u,CURLUPART_URL,&newurl,0);
            switch(CVar16) {
            case CURLUE_OK:
              CVar16 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
              if (CVar16 == CURLUE_OK) {
                (data->state).url = newurl;
                puVar2 = &(data->state).field_0x7c0;
                *puVar2 = *puVar2 | 1;
                host = local_70;
                if ((((data->set).field_0x89f & 0x40) != 0) &&
                   ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar7->log_level)))) {
                  Curl_infof(data,"Switched from HTTP to HTTPS due to HSTS => %s");
                  host = local_70;
                }
                goto LAB_0015ce5a;
              }
              (*Curl_cfree)(newurl);
              if (CVar16 - CURLUE_UNSUPPORTED_SCHEME < 4) {
                CVar18 = *(CURLcode *)
                          (&DAT_0017db4c + (ulong)(CVar16 - CURLUE_UNSUPPORTED_SCHEME) * 4);
              }
              break;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015cd7f_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015cd7f_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015cd7f_caseD_8;
            }
            break;
          case CURLUE_UNSUPPORTED_SCHEME:
switchD_0015cd7f_caseD_5:
            CVar18 = CURLE_UNSUPPORTED_PROTOCOL;
            break;
          case CURLUE_OUT_OF_MEMORY:
switchD_0015cd7f_caseD_7:
            CVar18 = CURLE_OUT_OF_MEMORY;
            break;
          case CURLUE_USER_NOT_ALLOWED:
switchD_0015cd7f_caseD_8:
            CVar18 = CURLE_LOGIN_DENIED;
          }
switchD_0015cbca_caseD_5:
          CVar20 = CVar18;
          goto switchD_0015cad1_caseD_5;
        }
      }
LAB_0015ce5a:
      pcVar22 = part->scheme;
      pCVar26 = Curl_get_scheme_handler(pcVar22);
      if (pCVar26 == (Curl_handler *)0x0) {
        pcVar41 = "not supported";
      }
      else {
        pcVar41 = "disabled";
        if ((((data->set).allowed_protocols & pCVar26->protocol) != 0) &&
           ((((data->state).field_0x7be & 8) == 0 ||
            (((data->set).redir_protocols & pCVar26->protocol) != 0)))) {
          conn->given = pCVar26;
          conn->handler = pCVar26;
          ppcVar1 = &(data->state).aptr.passwd;
          local_70 = host;
          if (((data->state).aptr.passwd == (char *)0x0) ||
             ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
            ppcVar3 = &(data->state).up.password;
            CVar16 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar3,0);
            switch(CVar16) {
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015cad1_caseD_5;
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
            case CURLUE_NO_USER:
switchD_0015cad1_caseD_1:
              CVar20 = CURLE_URL_MALFORMAT;
              goto switchD_0015cad1_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015cad1_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015cad1_caseD_8;
            case CURLUE_NO_PASSWORD:
              goto switchD_0015cf0c_caseD_c;
            default:
              if (CVar16 != CURLUE_OK) goto switchD_0015cad1_caseD_1;
              CVar18 = Curl_urldecode(*ppcVar3,0,&newurl,(size_t *)0x0,
                                      ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
              if (CVar18 == CURLE_OK) {
                conn->passwd = newurl;
                CVar18 = Curl_setstropt(ppcVar1,newurl);
                if (CVar18 == CURLE_OK) {
                  *(uint *)&(data->state).field_0x7be =
                       (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
                  goto switchD_0015cf0c_caseD_c;
                }
              }
            }
            goto LAB_0015ccc1;
          }
switchD_0015cf0c_caseD_c:
          ppcVar3 = &(data->state).aptr.user;
          if (((data->state).aptr.user == (char *)0x0) ||
             ((*(uint *)&(data->state).field_0x7be & 3) != 2)) {
            ppcVar4 = &(data->state).up.user;
            CVar16 = curl_url_get(u,CURLUPART_USER,ppcVar4,0);
            switch(CVar16) {
            case CURLUE_OK:
              CVar18 = Curl_urldecode(*ppcVar4,0,&newurl,(size_t *)0x0,
                                      ((conn->handler->flags >> 0xd & 1) != 0) + REJECT_CTRL);
              if (CVar18 == CURLE_OK) {
                conn->user = newurl;
                CVar18 = Curl_setstropt(ppcVar3,newurl);
                *(uint *)&(data->state).field_0x7be =
                     (*(uint *)&(data->state).field_0x7be & 0xfffffffc) + 1;
                if (CVar18 == CURLE_OK) goto switchD_0015cf66_caseD_b;
              }
              break;
            default:
              goto switchD_0015cf66_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015cad1_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0015cad1_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015cad1_caseD_8;
            case CURLUE_NO_USER:
              goto switchD_0015cf66_caseD_b;
            }
            goto LAB_0015ccc1;
          }
switchD_0015cf66_caseD_b:
          ppcVar4 = &(data->state).up.options;
          CVar16 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar4,0x40);
          switch(CVar16) {
          case CURLUE_UNSUPPORTED_SCHEME:
            goto switchD_0015cad1_caseD_5;
          case CURLUE_URLDECODE:
          case CURLUE_UNKNOWN_PART:
          case CURLUE_NO_SCHEME:
          case CURLUE_NO_USER:
          case CURLUE_NO_PASSWORD:
switchD_0015cf66_caseD_1:
            CVar20 = CURLE_URL_MALFORMAT;
            goto switchD_0015cad1_caseD_5;
          case CURLUE_OUT_OF_MEMORY:
            break;
          case CURLUE_USER_NOT_ALLOWED:
            goto switchD_0015cad1_caseD_8;
          case CURLUE_NO_OPTIONS:
switchD_0015cff8_caseD_d:
            CVar16 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0x80);
            switch(CVar16) {
            case CURLUE_OK:
              ppcVar4 = &(data->state).up.port;
              CVar16 = curl_url_get(u,CURLUPART_PORT,ppcVar4,1);
              if (CVar16 == CURLUE_OK) {
                uVar5 = (data->set).use_port;
                uVar19 = (uint)uVar5;
                if ((uVar5 == 0) || (((data->state).field_0x7be & 0x40) == 0)) {
                  local_38 = *ppcVar4;
                  iVar17 = Curl_str_number(&local_38,(curl_off_t *)&newurl,0xffff);
                  if (iVar17 != 0) goto LAB_0015d17e;
                  uVar19 = (uint)newurl;
                }
                conn->remote_port = uVar19 & 0xffff;
                (conn->primary).remote_port = uVar19 & 0xffff;
              }
              else {
                iVar17 = curl_strequal("file",part->scheme);
                if (iVar17 == 0) break;
              }
LAB_0015d17e:
              curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
              uVar19 = (data->set).scope_id;
              if (uVar19 != 0) {
                conn->scope_id = uVar19;
              }
              pcVar22 = (data->set).str[0x42];
              if (pcVar22 != (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->sasl_authzid = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              pcVar22 = (data->set).str[0x3c];
              if (pcVar22 != (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->oauth_bearer = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              pcVar22 = (data->set).str[0x3d];
              if (pcVar22 == (char *)0x0) {
                CVar35 = conn->bits;
              }
              else {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                conn->unix_domain_socket = pcVar22;
                if (pcVar22 == (char *)0x0) break;
                CVar35 = (ConnectBits)
                         ((ulong)conn->bits & 0xfffffffffbffffff |
                         (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0x16) & 0x4000000));
                conn->bits = CVar35;
              }
              if (((ulong)CVar35 & 4) == 0) {
LAB_0015d2ab:
                pcVar22 = (data->set).str[0x26];
                if (pcVar22 == (char *)0x0) {
                  local_b8 = (curl_slist **)0x0;
                }
                else {
                  local_b8 = (curl_slist **)(*Curl_cstrdup)(pcVar22);
                  if (local_b8 == (curl_slist **)0x0) {
                    Curl_failf(data,"memory shortage");
                    CVar18 = CURLE_OUT_OF_MEMORY;
                    goto LAB_0015d621;
                  }
                }
                pcVar22 = (data->set).str[0x27];
                if (pcVar22 == (char *)0x0) {
                  local_b0 = (char *)0x0;
LAB_0015d33e:
                  if ((data->set).str[0x32] == (char *)0x0) {
                    pcVar41 = "no_proxy";
                    pcVar22 = curl_getenv("no_proxy");
                    if (pcVar22 == (char *)0x0) {
                      pcVar41 = "NO_PROXY";
                      pcVar22 = curl_getenv("NO_PROXY");
                      if (pcVar22 == (char *)0x0) goto LAB_0015d34c;
                    }
                    if ((((data->set).field_0x89f & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar41,pcVar22);
                    }
                  }
                  else {
LAB_0015d34c:
                    pcVar22 = (char *)0x0;
                  }
                  pcVar41 = (data->set).str[0x32];
                  if (pcVar41 == (char *)0x0) {
                    pcVar41 = pcVar22;
                  }
                  _Var13 = Curl_check_noproxy((conn->host).name,pcVar41);
                  if (_Var13) {
                    (*Curl_cfree)(local_b8);
                    (*Curl_cfree)(local_b0);
LAB_0015d385:
                    local_b8 = (curl_slist **)0x0;
LAB_0015d38d:
                    local_b0 = (char *)0x0;
                  }
                  else if (local_b8 == (curl_slist **)0x0 && local_b0 == (char *)0x0) {
                    pcVar41 = (char *)&newurl;
                    curl_msnprintf(pcVar41,0x14,"%s_proxy",conn->handler->scheme);
                    local_b8 = (curl_slist **)curl_getenv(pcVar41);
                    if (local_b8 == (curl_slist **)0x0) {
                      pcVar41 = (char *)&newurl;
                      pcVar38 = "http_proxy";
                      iVar17 = curl_strequal("http_proxy",pcVar41);
                      if (iVar17 == 0) {
                        Curl_strntoupper(pcVar41,pcVar41,0x14);
                        local_b8 = (curl_slist **)curl_getenv(pcVar41);
                        if (local_b8 != (curl_slist **)0x0) goto LAB_0015d57e;
                      }
                      iVar17 = curl_strequal("ws_proxy",(char *)&newurl);
                      if (iVar17 == 0) {
                        pcVar41 = (char *)&newurl;
                        iVar17 = curl_strequal("wss_proxy",pcVar41);
                        if (iVar17 != 0) {
                          local_b8 = (curl_slist **)curl_getenv("https_proxy");
                          if (local_b8 != (curl_slist **)0x0) goto LAB_0015d57e;
                          pcVar38 = "HTTPS_PROXY";
                          goto LAB_0015d6bf;
                        }
                      }
                      else {
LAB_0015d6bf:
                        local_b8 = (curl_slist **)curl_getenv(pcVar38);
                        if (local_b8 != (curl_slist **)0x0) {
                          pcVar41 = (char *)&newurl;
                          goto LAB_0015d57e;
                        }
                      }
                      pcVar41 = "all_proxy";
                      local_b8 = (curl_slist **)curl_getenv("all_proxy");
                      if (local_b8 == (curl_slist **)0x0) {
                        pcVar41 = "ALL_PROXY";
                        local_b8 = (curl_slist **)curl_getenv("ALL_PROXY");
                        if (local_b8 == (curl_slist **)0x0) goto LAB_0015d385;
                      }
                    }
LAB_0015d57e:
                    if ((((data->set).field_0x89f & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      Curl_infof(data,"Uses proxy env variable %s == \'%s\'",pcVar41,local_b8);
                    }
                    goto LAB_0015d38d;
                  }
                  (*Curl_cfree)(pcVar22);
                  if (local_b8 == (curl_slist **)0x0) {
LAB_0015d3d5:
                    local_b8 = (curl_slist **)0x0;
                  }
                  else if (((conn->unix_domain_socket != (char *)0x0) || (*(char *)local_b8 == '\0')
                           ) || ((conn->handler->flags & 0x10) != 0)) {
                    (*Curl_cfree)(local_b8);
                    goto LAB_0015d3d5;
                  }
                  if (local_b0 == (char *)0x0) {
LAB_0015d438:
                    if (local_b8 != (curl_slist **)0x0) {
                      local_74 = (curl_proxytype)(conn->http_proxy).proxytype;
                      local_b0 = (char *)0x0;
                      local_50 = 0;
LAB_0015d46d:
                      local_58 = &conn->http_proxy;
                      CVar18 = parse_proxy(data,conn,(char *)local_b8,local_74);
                      (*Curl_cfree)(local_b8);
                      if (CVar18 == CURLE_OK) {
                        if ((char)local_50 != '\0') goto LAB_0015d5eb;
                        goto LAB_0015d62f;
                      }
                      local_b8 = (curl_slist **)0x0;
                      goto LAB_0015d862;
                    }
                    uVar27 = (ulong)conn->bits & 0xfffffffffffffffc;
                  }
                  else {
                    if ((*local_b0 == '\0') || ((conn->handler->flags & 0x10) != 0)) {
                      (*Curl_cfree)(local_b0);
                      goto LAB_0015d438;
                    }
                    local_58 = &conn->http_proxy;
                    local_74 = (curl_proxytype)(conn->http_proxy).proxytype;
                    local_50 = 1;
                    if (local_b8 != (curl_slist **)0x0) goto LAB_0015d46d;
LAB_0015d5eb:
                    CVar18 = parse_proxy(data,conn,local_b0,local_74);
                    (*Curl_cfree)(local_b0);
                    if (CVar18 != CURLE_OK) goto LAB_0015d621;
LAB_0015d62f:
                    if ((local_58->host).rawalloc == (char *)0x0) {
                      CVar35 = (ConnectBits)((ulong)conn->bits & 0xfffffffffffffff6);
                      conn->bits = CVar35;
                      if ((conn->socks_proxy).host.rawalloc == (char *)0x0) goto LAB_0015d80e;
                      if ((conn->socks_proxy).user == (char *)0x0) {
                        pcVar22 = (conn->socks_proxy).passwd;
                        (conn->socks_proxy).user = (conn->http_proxy).user;
                        (conn->http_proxy).user = (char *)0x0;
                        (*Curl_cfree)(pcVar22);
                        (conn->socks_proxy).passwd = (conn->http_proxy).passwd;
                        (conn->http_proxy).passwd = (char *)0x0;
                        CVar35 = conn->bits;
                      }
                    }
                    else {
                      CVar35 = conn->bits;
                      if ((conn->handler->protocol & 0xc0000003) == 0) {
                        if (((conn->handler->flags & 0x800) == 0) || (((ulong)CVar35 & 8) != 0)) {
                          CVar35 = (ConnectBits)((ulong)CVar35 | 8);
                        }
                        else {
                          conn->handler = &Curl_handler_http;
                        }
                      }
                      CVar35 = (ConnectBits)((ulong)CVar35 | 1);
                      if ((conn->socks_proxy).host.rawalloc == (char *)0x0) {
LAB_0015d80e:
                        uVar27 = (ulong)CVar35 & 0xfffffffffffffffd;
                        goto LAB_0015d812;
                      }
                    }
                    uVar27 = (ulong)CVar35 | 2;
                  }
LAB_0015d812:
                  uVar21 = 0x10;
                  if ((uVar27 & 1) == 0) {
                    uVar21 = (ulong)((int)uVar27 * 8 & 0x10);
                  }
                  conn->bits = (ConnectBits)(uVar27 & 0xffffffffffffffef | uVar21);
                  if (uVar21 == 0) {
                    conn->bits = (ConnectBits)(uVar27 & 0xffffffffffffffe0);
                    (conn->http_proxy).proxytype = '\0';
                  }
                  local_b8 = (curl_slist **)0x0;
                  local_b0 = (char *)0x0;
                  CVar18 = CURLE_OK;
                }
                else {
                  local_b0 = (*Curl_cstrdup)(pcVar22);
                  if (local_b0 != (char *)0x0) goto LAB_0015d33e;
                  local_b0 = (char *)0x0;
                  Curl_failf(data,"memory shortage");
                  CVar18 = CURLE_OUT_OF_MEMORY;
                }
              }
              else {
                pcVar22 = (data->state).aptr.proxyuser;
                pcVar41 = (data->state).aptr.proxypasswd;
                if (pcVar22 == (char *)0x0) {
                  pcVar22 = "";
                }
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                (conn->http_proxy).user = pcVar22;
                CVar18 = CURLE_OUT_OF_MEMORY;
                if (pcVar22 != (char *)0x0) {
                  if (pcVar41 == (char *)0x0) {
                    pcVar41 = "";
                  }
                  pcVar22 = (*Curl_cstrdup)(pcVar41);
                  (conn->http_proxy).passwd = pcVar22;
                  if (pcVar22 != (char *)0x0) goto LAB_0015d2ab;
                  (*Curl_cfree)((conn->http_proxy).user);
                  (conn->http_proxy).user = (char *)0x0;
                }
LAB_0015d621:
                local_b8 = (curl_slist **)0x0;
                local_b0 = (char *)0x0;
              }
LAB_0015d862:
              (*Curl_cfree)(local_b0);
              (*Curl_cfree)(local_b8);
              if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
              if (((conn->given->flags & 1) != 0) && (((ulong)conn->bits & 1) != 0)) {
                conn->bits = (ConnectBits)((ulong)conn->bits | 8);
              }
              uVar5 = (data->set).use_port;
              if ((uVar5 != 0) && (((data->state).field_0x7be & 0x40) != 0)) {
                conn->remote_port = (uint)uVar5;
                curl_msnprintf((char *)&newurl,0x10,"%d");
                CVar16 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)&newurl,0);
                if (CVar16 != CURLUE_OK) break;
              }
              if ((data->set).str[0x2f] != (char *)0x0) {
                (*Curl_cfree)(conn->options);
                pcVar22 = (*Curl_cstrdup)((data->set).str[0x2f]);
                conn->options = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              ppcVar4 = &conn->user;
              passwordp = &conn->passwd;
              if ((data->set).use_netrc == '\x02') {
                (*Curl_cfree)(*ppcVar4);
                *ppcVar4 = (char *)0x0;
                (*Curl_cfree)(*passwordp);
                *passwordp = (char *)0x0;
              }
              puVar2 = &(conn->bits).field_0x2;
              *puVar2 = *puVar2 & 0xf7;
              ppcVar40 = ppcVar4;
              if (((data->set).use_netrc == '\0') || ((data->set).str[0x2d] != (char *)0x0)) {
                pcVar22 = *ppcVar4;
                if (pcVar22 != (char *)0x0) goto LAB_0015d9a4;
LAB_0015d9ca:
                pcVar41 = *ppcVar3;
              }
              else {
                if (*ppcVar3 == (char *)0x0) {
                  bVar43 = false;
                }
                else {
                  bVar43 = (~*(uint *)&(data->state).field_0x7be & 3) != 0;
                  if (bVar43) {
                    ppcVar40 = ppcVar3;
                  }
                }
                if (*passwordp == (char *)0x0) {
                  ret = Curl_parsenetrc(&(data->state).netrc,(conn->host).name,ppcVar40,passwordp,
                                        (data->set).str[0x25]);
                  if (ret == NETRC_OK) {
                    if (((conn->handler->flags & 0x2000) == 0) &&
                       ((_Var13 = str_has_ctrl(*ppcVar40), _Var13 ||
                        (_Var13 = str_has_ctrl(*passwordp), _Var13)))) {
                      Curl_failf(data,"control code detected in .netrc credentials");
                      goto LAB_0015e2be;
                    }
                    puVar2 = &(conn->bits).field_0x2;
                    *puVar2 = *puVar2 | 8;
                  }
                  else {
                    if ((ret != NETRC_NO_MATCH) && ((data->set).use_netrc != '\x01')) {
                      pcVar22 = Curl_netrc_strerror(ret);
                      Curl_failf(data,".netrc error: %s",pcVar22);
LAB_0015e2be:
                      CVar20 = CURLE_READ_ERROR;
                      goto switchD_0015cad1_caseD_5;
                    }
                    if ((((data->set).field_0x89f & 0x40) != 0) &&
                       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                        (0 < pcVar7->log_level)))) {
                      pcVar22 = (data->set).str[0x25];
                      pcVar41 = ".netrc";
                      if (pcVar22 != (char *)0x0) {
                        pcVar41 = pcVar22;
                      }
                      Curl_infof(data,"Couldn\'t find host %s in the %s file; using defaults",
                                 (conn->host).name,pcVar41);
                    }
                  }
                }
                if (bVar43) {
                  (*Curl_cfree)(*ppcVar4);
                  pcVar22 = (*Curl_cstrdup)(*ppcVar40);
                  *ppcVar4 = pcVar22;
                  if (pcVar22 == (char *)0x0) break;
                }
                pcVar22 = *ppcVar40;
                if (pcVar22 == (char *)0x0) {
                  if (*passwordp == (char *)0x0) goto LAB_0015d9ca;
                  pcVar22 = (*Curl_cstrdup)("");
                  *ppcVar40 = pcVar22;
                  if (pcVar22 == (char *)0x0) break;
                }
LAB_0015d9a4:
                pcVar41 = *ppcVar3;
                if (pcVar41 != pcVar22) {
                  CVar18 = Curl_setstropt(ppcVar3,pcVar22);
                  if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                  puVar2 = &(data->state).field_0x7be;
                  *puVar2 = *puVar2 | 3;
                  goto LAB_0015d9ca;
                }
              }
              CVar20 = CURLE_UNSUPPORTED_PROTOCOL;
              if (pcVar41 != (char *)0x0) {
                CVar16 = curl_url_set((data->state).uh,CURLUPART_USER,pcVar41,0x80);
                switch(CVar16) {
                case CURLUE_OK:
                  if (*ppcVar40 == (char *)0x0) {
                    pcVar22 = (*Curl_cstrdup)(*ppcVar3);
                    *ppcVar40 = pcVar22;
                    if (pcVar22 == (char *)0x0) goto switchD_0015cad1_caseD_7;
                  }
                  break;
                default:
                  goto switchD_0015cf66_caseD_1;
                case CURLUE_UNSUPPORTED_SCHEME:
                  goto switchD_0015cad1_caseD_5;
                case CURLUE_OUT_OF_MEMORY:
                  goto switchD_0015cad1_caseD_7;
                case CURLUE_USER_NOT_ALLOWED:
                  goto switchD_0015cad1_caseD_8;
                }
              }
              if (*passwordp != (char *)0x0) {
                CVar18 = Curl_setstropt(ppcVar1,*passwordp);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                puVar2 = &(data->state).field_0x7be;
                *puVar2 = *puVar2 | 3;
              }
              if (*ppcVar1 != (char *)0x0) {
                CVar16 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*ppcVar1,0x80);
                switch(CVar16) {
                case CURLUE_OK:
                  if (*passwordp == (char *)0x0) {
                    pcVar22 = (*Curl_cstrdup)(*ppcVar1);
                    *passwordp = pcVar22;
                    if (pcVar22 == (char *)0x0) goto switchD_0015cad1_caseD_7;
                  }
                  goto LAB_0015dabb;
                default:
                  CVar20 = CURLE_URL_MALFORMAT;
                  break;
                case CURLUE_UNSUPPORTED_SCHEME:
                  break;
                case CURLUE_OUT_OF_MEMORY:
                  goto switchD_0015cad1_caseD_7;
                case CURLUE_USER_NOT_ALLOWED:
                  goto switchD_0015cad1_caseD_8;
                }
                goto switchD_0015cad1_caseD_5;
              }
LAB_0015dabb:
              if (((conn->handler->flags & 0x20) == 0) || (*ppcVar3 != (char *)0x0)) {
                pcVar22 = "";
                pcVar41 = "";
              }
              else {
                pcVar41 = "ftp@example.com";
                pcVar22 = "anonymous";
              }
              if (*ppcVar4 == (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar22);
                *ppcVar4 = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              if (*passwordp == (char *)0x0) {
                pcVar22 = (*Curl_cstrdup)(pcVar41);
                *passwordp = pcVar22;
                if (pcVar22 == (char *)0x0) break;
              }
              local_b8 = &(data->set).connect_to;
              uVar19 = 0xffffffff;
              pcVar22 = (char *)0x0;
LAB_0015db4c:
              if (((uVar19 == 0xffffffff) && (pcVar22 == (char *)0x0)) &&
                 (pcVar6 = *local_b8, pcVar6 != (curl_slist *)0x0)) {
                pcVar22 = pcVar6->data;
                if (*pcVar22 == ':') {
                  local_68 = pcVar22 + 1;
LAB_0015dc19:
                  if (*local_68 == ':') {
                    local_68 = local_68 + 1;
                  }
                  else {
                    pcVar22 = strchr(local_68,0x3a);
                    if (((pcVar22 == (char *)0x0) ||
                        (iVar17 = Curl_str_number(&local_68,(curl_off_t *)&newurl,0xffff),
                        iVar17 != 0)) ||
                       (local_68 = pcVar22 + 1, newurl != (char *)(long)conn->remote_port))
                    goto LAB_0015dcee;
                  }
                  if (*local_68 == '\0') goto LAB_0015dcee;
                  pbVar28 = (byte *)(*Curl_cstrdup)(local_68);
                  if (pbVar28 != (byte *)0x0) {
                    __s = pbVar28;
                    pbVar39 = pbVar28;
                    if (*pbVar28 == 0x5b) {
                      pbVar42 = pbVar28 + 2;
                      pbVar39 = pbVar28 + 1;
                      for (__s = pbVar39; bVar15 = *__s, bVar15 != 0; __s = __s + 1) {
                        if ((9 < (byte)(bVar15 - 0x30)) &&
                           ((0x38 < bVar15 - 0x2e ||
                            ((0x1f8000001f81001U >> ((ulong)(bVar15 - 0x2e) & 0x3f) & 1) == 0)))) {
                          if (bVar15 != 0x25) goto LAB_0015ddee;
                          if (__s[1] - 0x32 == 0) {
                            iVar17 = 0x35 - (uint)__s[2];
                          }
                          else {
                            iVar17 = -(__s[1] - 0x32);
                          }
                          __s = pbVar42;
                          if (((iVar17 != 0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                             ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                              (0 < pcVar7->log_level)))) {
                            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.");
                          }
                          goto LAB_0015ddb2;
                        }
                        pbVar42 = pbVar42 + 1;
                      }
                      goto LAB_0015ddfb;
                    }
                    goto LAB_0015de27;
                  }
                }
                else {
                  bVar43 = (*(uint *)&conn->bits >> 10 & 1) == 0;
                  pcVar41 = "[";
                  if (bVar43) {
                    pcVar41 = "";
                  }
                  pcVar38 = "]";
                  if (bVar43) {
                    pcVar38 = "";
                  }
                  pcVar41 = curl_maprintf("%s%s%s",pcVar41,(conn->host).name,pcVar38);
                  if (pcVar41 != (char *)0x0) {
                    sVar24 = strlen(pcVar41);
                    iVar17 = curl_strnequal(pcVar22,pcVar41,sVar24);
                    (*Curl_cfree)(pcVar41);
                    if ((iVar17 != 0) && (local_68 = pcVar22 + sVar24 + 1, pcVar22[sVar24] == ':'))
                    goto LAB_0015dc19;
LAB_0015dcee:
                    pcVar22 = (char *)0x0;
                    uVar19 = 0xffffffff;
                    goto LAB_0015dcf4;
                  }
                }
                break;
              }
              if ((((uVar19 == 0xffffffff) && (pcVar22 == (char *)0x0)) &&
                  (asi = data->asi, asi != (altsvcinfo *)0x0)) &&
                 (((conn->handler->protocol == 2 &&
                   (newurl = (char *)0x0, ((data->state).http_neg.wanted & 1) != 0)) &&
                  (((data->state).http_neg.field_0x3 & 8) == 0)))) {
                pcVar22 = local_70->rawalloc;
                _Var13 = Curl_altsvc_lookup(asi,ALPN_h1,pcVar22,conn->remote_port,(altsvc **)&newurl
                                            ,(uint)(data->state).http_neg.allowed << 3 &
                                             (uint)asi->flags & 8);
                if (_Var13) {
                  pcVar41 = (*Curl_cstrdup)(*(char **)(newurl + 0x10));
                  if (pcVar41 == (char *)0x0) break;
                  (conn->conn_to_host).rawalloc = pcVar41;
                  (conn->conn_to_host).name = pcVar41;
                  CVar35 = conn->bits;
                  conn->bits = (ConnectBits)((ulong)CVar35 | 0x100);
                  conn->conn_to_port = (uint)*(ushort *)(newurl + 0x18);
                  conn->bits = (ConnectBits)((ulong)CVar35 | 0x380);
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar7->log_level)))) {
                    pcVar38 = Curl_alpnid2str(ALPN_h1);
                    uVar19 = conn->remote_port;
                    pcVar29 = Curl_alpnid2str(*(alpnid *)(newurl + 0x1c));
                    Curl_infof(data,"Alt-svc connecting from [%s]%s:%d to [%s]%s:%d",pcVar38,pcVar22
                               ,(ulong)uVar19,pcVar29,pcVar41,(ulong)*(ushort *)(newurl + 0x18));
                  }
                  if (*(int *)(newurl + 0x1c) == 0x10) {
                    hVar14 = '\x02';
                  }
                  else {
                    if (*(int *)(newurl + 0x1c) != 0x20) goto LAB_0015e2d3;
                    conn->transport = '\x05';
                    hVar14 = '\x04';
                  }
                  (data->state).http_neg.allowed = hVar14;
                  (data->state).http_neg.wanted = hVar14;
                }
              }
LAB_0015e2d3:
              CVar35 = conn->bits;
              if (((ulong)CVar35 & 1) != 0) {
                CVar18 = Curl_idnconvert_hostname(&(conn->http_proxy).host);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                CVar35 = conn->bits;
              }
              if (((ulong)CVar35 & 2) != 0) {
                CVar18 = Curl_idnconvert_hostname(&(conn->socks_proxy).host);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                CVar35 = conn->bits;
              }
              if ((CVar35._0_4_ >> 8 & 1) != 0) {
                CVar18 = Curl_idnconvert_hostname(&conn->conn_to_host);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                CVar35 = conn->bits;
                if ((CVar35._0_4_ >> 8 & 1) != 0) {
                  iVar17 = curl_strequal((conn->conn_to_host).name,(conn->host).name);
                  CVar35 = conn->bits;
                  if (iVar17 != 0) {
                    CVar35 = (ConnectBits)((ulong)CVar35 & 0xfffffffffffffeff);
                    conn->bits = CVar35;
                  }
                }
              }
              if (((CVar35._0_4_ >> 9 & 1) != 0) && (conn->conn_to_port == conn->remote_port)) {
                CVar35 = (ConnectBits)((ulong)CVar35 & 0xfffffffffffffdff);
                conn->bits = CVar35;
              }
              if (((ulong)CVar35 & 1) != 0 && ((ulong)CVar35 & 0x300) != 0) {
                conn->bits = (ConnectBits)((ulong)CVar35 | 8);
              }
              pCVar26 = conn->handler;
              if (pCVar26->setup_connection != (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0)
              {
                CVar18 = (*pCVar26->setup_connection)(data,conn);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                pCVar26 = conn->handler;
              }
              uVar19 = (conn->primary).remote_port;
              if ((int)uVar19 < 0) {
                uVar19 = pCVar26->defport;
                (conn->primary).remote_port = uVar19;
              }
              uVar27 = (ulong)uVar19;
              uVar19 = SUB84(conn->bits,0);
              lVar30 = 0x138;
              if ((uVar19 & 9) != 1) {
                uVar27 = (ulong)(uint)conn->remote_port;
                lVar30 = 0xe0;
                if ((uVar19 >> 8 & 1) == 0) {
                  lVar30 = 0xb0;
                }
              }
              pcVar22 = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,uVar27,
                                      *(undefined8 *)((long)&(conn->cpool_node)._list + lVar30));
              conn->destination = pcVar22;
              CVar20 = CURLE_OUT_OF_MEMORY;
              if (pcVar22 == (char *)0x0) goto switchD_0015cad1_caseD_5;
              sVar24 = strlen(pcVar22);
              Curl_strntolower(pcVar22,pcVar22,sVar24);
              pCVar26 = conn->handler;
              if ((pCVar26->flags & 0x10) == 0) {
                conn->recv[0] = Curl_cf_recv;
                conn->send[0] = Curl_cf_send;
                conn->recv[1] = Curl_cf_recv;
                conn->send[1] = Curl_cf_send;
                conn->bits = (ConnectBits)
                             ((ulong)conn->bits & 0xffffffffff7fffff |
                             (ulong)((uint)(*(ulong *)&(data->set).field_0x89c >> 0x12) & 0x800000))
                ;
                CVar18 = Curl_ssl_easy_config_complete(data);
                if (CVar18 != CURLE_OK) goto LAB_0015ccc1;
                Curl_cpool_prune_dead(data);
                uVar27 = *(ulong *)&(data->set).field_0x89c;
                if ((uVar27 >> 0x20 & 1) == 0) {
                  if ((uVar27 & 1) != 0) {
                    bVar15 = 0;
                    goto LAB_0015e949;
                  }
LAB_0015e60f:
                  newurl = (char *)0x0;
                  uStack_80 = 0;
                  pCStack_90 = data;
                  local_88 = conn;
                  if (((((conn->handler->protocol & 0xc0000003) == 0) ||
                       ((~*(uint *)&conn->bits & 0x2020) == 0)) ||
                      (_Var13 = Curl_multiplex_wanted(data->multi), !_Var13)) ||
                     (bVar15 = 1, ((data->state).http_neg.allowed & 6) == 0)) {
                    bVar15 = 0;
                  }
                  if (((data->state).authhost.want & 8) == 0) {
                    bVar34 = 0;
                  }
                  else {
                    bVar34 = ((conn->handler->protocol & 0xc0000003) != 0) * '\x02';
                  }
                  if ((((ulong)conn->bits & 4) == 0) || (((data->state).authproxy.want & 8) == 0)) {
                    bVar36 = 0;
                  }
                  else {
                    bVar36 = ((conn->handler->protocol & 0xc0000003) != 0) << 2;
                  }
                  uStack_80 = CONCAT71(uStack_80._1_7_,bVar34 | bVar15 | bVar36);
                  _Var13 = Curl_cpool_find(data,conn->destination,url_match_conn,url_match_result,
                                           &newurl);
                  conn_00 = (connectdata *)newurl;
                  if (!_Var13) {
                    bVar15 = (byte)uStack_80 >> 3;
                    goto LAB_0015e949;
                  }
                  if ((conn->given->flags & 1) == 0) {
                    _Var13 = Curl_conn_is_ssl(conn,0);
                    local_48 = "";
                    if (_Var13) {
                      local_48 = " (upgraded to SSL)";
                    }
                  }
                  if (*ppcVar4 != (char *)0x0) {
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x228));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x230));
                    pcVar22 = conn->passwd;
                    *(char **)((long)conn_00 + 0x228) = *ppcVar4;
                    *(char **)((long)conn_00 + 0x230) = pcVar22;
                    *ppcVar4 = (char *)0x0;
                    conn->passwd = (char *)0x0;
                  }
                  uVar27 = (ulong)(SUB84(conn->bits,0) & 4);
                  *(ulong *)((long)conn_00 + 0x3e0) =
                       *(ulong *)((long)conn_00 + 0x3e0) & 0xfffffffffffffffb | uVar27;
                  if (uVar27 != 0) {
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x150));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x118));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x158));
                    (*Curl_cfree)(*(void **)((long)conn_00 + 0x120));
                    pcVar22 = (conn->http_proxy).passwd;
                    *(char **)((long)conn_00 + 0x150) = (conn->http_proxy).user;
                    *(char **)((long)conn_00 + 0x158) = pcVar22;
                    pcVar22 = (conn->socks_proxy).passwd;
                    *(char **)((long)conn_00 + 0x118) = (conn->socks_proxy).user;
                    *(char **)((long)conn_00 + 0x120) = pcVar22;
                    (conn->socks_proxy).user = (char *)0x0;
                    (conn->socks_proxy).passwd = (char *)0x0;
                    (conn->http_proxy).user = (char *)0x0;
                    (conn->http_proxy).passwd = (char *)0x0;
                  }
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0xa0));
                  *(char *)((long)conn_00 + 0xa0) = '\0';
                  *(char *)((long)conn_00 + 0xa1) = '\0';
                  *(char *)((long)conn_00 + 0xa2) = '\0';
                  *(char *)((long)conn_00 + 0xa3) = '\0';
                  *(char *)((long)conn_00 + 0xa4) = '\0';
                  *(char *)((long)conn_00 + 0xa5) = '\0';
                  *(char *)((long)conn_00 + 0xa6) = '\0';
                  *(char *)((long)conn_00 + 0xa7) = '\0';
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0xd0));
                  *(char *)((long)conn_00 + 0xd0) = '\0';
                  *(char *)((long)conn_00 + 0xd1) = '\0';
                  *(char *)((long)conn_00 + 0xd2) = '\0';
                  *(char *)((long)conn_00 + 0xd3) = '\0';
                  *(char *)((long)conn_00 + 0xd4) = '\0';
                  *(char *)((long)conn_00 + 0xd5) = '\0';
                  *(char *)((long)conn_00 + 0xd6) = '\0';
                  *(char *)((long)conn_00 + 0xd7) = '\0';
                  pcVar22 = local_70->encalloc;
                  pcVar41 = local_70->name;
                  pcVar38 = local_70->dispname;
                  *(char **)((long)conn_00 + 0xa0) = local_70->rawalloc;
                  *(char **)((long)conn_00 + 0xa8) = pcVar22;
                  *(char **)((long)conn_00 + 0xb0) = pcVar41;
                  *(char **)((long)conn_00 + 0xb8) = pcVar38;
                  local_70->rawalloc = (char *)0x0;
                  local_70->encalloc = (char *)0x0;
                  pcVar22 = (conn->conn_to_host).rawalloc;
                  pcVar41 = (conn->conn_to_host).encalloc;
                  pcVar38 = (conn->conn_to_host).dispname;
                  *(char **)((long)conn_00 + 0xe0) = (conn->conn_to_host).name;
                  *(char **)((long)conn_00 + 0xe8) = pcVar38;
                  *(char **)((long)conn_00 + 0xd0) = pcVar22;
                  *(char **)((long)conn_00 + 0xd8) = pcVar41;
                  (conn->conn_to_host).rawalloc = (char *)0x0;
                  *(undefined8 *)((long)conn_00 + 0x5a8) = *(undefined8 *)&conn->remote_port;
                  (*Curl_cfree)(*(void **)((long)conn_00 + 0xc0));
                  *(char **)((long)conn_00 + 0xc0) = conn->hostname_resolve;
                  conn->hostname_resolve = (char *)0x0;
                  *(byte *)((long)conn_00 + 0x3e0) = *(byte *)((long)conn_00 + 0x3e0) | 0x40;
                  Curl_conn_free(data,conn);
                  if ((((data->set).field_0x89f & 0x40) != 0) &&
                     ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                      (0 < pcVar7->log_level)))) {
                    pcVar22 = "proxy";
                    if ((*(byte *)((long)conn_00 + 0x3e0) & 0x10) == 0) {
                      pcVar22 = "host";
                    }
                    lVar30 = 0x108;
                    if ((*(long *)((long)conn_00 + 0x100) == 0) &&
                       (lVar30 = 0x140, *(long *)((long)conn_00 + 0x138) == 0)) {
                      lVar30 = 0xb8;
                    }
                    Curl_infof(data,"Re-using existing %s: connection%s with %s %s",
                               **(undefined8 **)((long)conn_00 + 0x3f0),local_48,pcVar22,
                               *(undefined8 *)((long)conn_00 + lVar30));
                  }
LAB_0015e918:
                  CVar18 = Curl_init_do(data,conn_00);
                  conn = conn_00;
                  if (CVar18 == CURLE_OK) {
                    CVar20 = setup_range(data);
                    if (CVar20 != CURLE_OK) goto switchD_0015cad1_caseD_5;
                    if (((ulong)conn_00->bits & 0x40) == 0) {
                      tVar31 = Curl_timeleft(data,(curltime *)0x0,true);
                      pcVar22 = conn_00->unix_domain_socket;
                      if (pcVar22 == (char *)0x0) {
                        CVar35 = conn_00->bits;
                        if (((ulong)CVar35 & 0x10) == 0) {
                          lVar30 = 0xd0;
                          if ((CVar35._0_4_ >> 8 & 1) == 0) {
                            lVar30 = 0xa0;
                          }
                          (conn_00->primary).remote_port =
                               *(int *)((long)&conn_00->remote_port + (ulong)(CVar35._0_4_ >> 7 & 4)
                                       );
                          pcVar22 = "host";
                        }
                        else {
                          pcVar22 = (conn_00->socks_proxy).host.name;
                          if ((pcVar22 != (char *)0x0) &&
                             (iVar17 = strncmp("localhost/",pcVar22,10), iVar17 == 0)) {
                            pcVar22 = pcVar22 + 9;
                            goto LAB_0015eb8c;
                          }
                          lVar30 = 0xf0;
                          if (((ulong)CVar35 & 2) == 0) {
                            lVar30 = 0x128;
                          }
                          pcVar22 = "proxy";
                        }
                        pcVar41 = (*Curl_cstrdup)(*(char **)((long)&(conn_00->cpool_node)._prev +
                                                            lVar30));
                        conn_00->hostname_resolve = pcVar41;
                        CVar20 = CURLE_OUT_OF_MEMORY;
                        if (pcVar41 == (char *)0x0) goto switchD_0015cad1_caseD_5;
                        CVar18 = Curl_resolv_timeout(data,pcVar41,(conn_00->primary).remote_port,
                                                     (uint)conn_00->ip_version,&conn_00->dns_entry,
                                                     tVar31);
                        if (CVar18 != CURLE_OK) {
                          if (CVar18 == CURLE_OPERATION_TIMEDOUT) {
                            uVar8 = *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar30);
                            cVar44 = Curl_now();
                            uVar9 = (data->progress).t_startsingle.tv_sec;
                            uVar10 = (data->progress).t_startsingle.tv_usec;
                            older.tv_usec = uVar10;
                            older.tv_sec = uVar9;
                            newer._12_4_ = 0;
                            newer.tv_sec = SUB128(cVar44._0_12_,0);
                            newer.tv_usec = SUB124(cVar44._0_12_,8);
                            older._12_4_ = 0;
                            tVar31 = Curl_timediff(newer,older);
                            Curl_failf(data,"Failed to resolve %s \'%s\' with timeout after %ld ms",
                                       pcVar22,uVar8,tVar31);
                            CVar20 = CURLE_OPERATION_TIMEDOUT;
                            goto switchD_0015cad1_caseD_5;
                          }
                          if (CVar18 != CURLE_AGAIN) {
                            Curl_failf(data,"Could not resolve %s: %s",pcVar22,
                                       *(undefined8 *)((long)&(conn_00->cpool_node)._next + lVar30))
                            ;
                            goto LAB_0015ccc1;
                          }
                          *local_60 = true;
                        }
                      }
                      else {
LAB_0015eb8c:
                        conn_00->transport = '\x06';
                        newurl = (char *)((ulong)newurl & 0xffffffffffffff00);
                        pCVar32 = (Curl_dns_entry *)(*Curl_ccalloc)(1,0x20);
                        if (pCVar32 == (Curl_dns_entry *)0x0) break;
                        pCVar33 = Curl_unix2addr(pcVar22,(_Bool *)&newurl,
                                                 (_Bool)((byte)((uint)*(undefined4 *)&conn_00->bits
                                                               >> 0x1a) & 1));
                        pCVar32->addr = pCVar33;
                        if (pCVar33 == (Curl_addrinfo *)0x0) {
                          if ((char)newurl == '\x01') {
                            Curl_failf(data,"Unix socket path too long: \'%s\'",pcVar22);
                          }
                          (*Curl_cfree)(pCVar32);
                          CVar20 = CURLE_OUT_OF_MEMORY;
                          if ((char)newurl != '\0') {
                            CVar20 = CURLE_COULDNT_RESOLVE_HOST;
                          }
                          goto switchD_0015cad1_caseD_5;
                        }
                        pCVar32->refcount = 1;
                        conn_00->dns_entry = pCVar32;
                      }
                    }
                    else {
                      *local_60 = false;
                    }
                    pCVar26 = conn_00->handler;
                    (data->info).conn_scheme = pCVar26->scheme;
                    (data->info).conn_protocol = pCVar26->protocol & 0x3ffffff;
                    (data->info).field_0xf4 =
                         (data->info).field_0xf4 & 0xfd | *(byte *)&conn_00->bits >> 3 & 2;
                    CVar18 = Curl_conn_ev_data_setup(data);
                    goto LAB_0015e5a3;
                  }
                }
                else {
                  bVar15 = 0;
                  if (((uVar27 & 1) == 0) && ((data->state).followlocation != 0)) goto LAB_0015e60f;
LAB_0015e949:
                  if (((conn->handler->flags & 0x100) != 0) && (((data->set).field_0x8a1 & 4) != 0))
                  {
                    puVar2 = &(conn->bits).field_0x3;
                    *puVar2 = *puVar2 | 1;
                  }
                  if ((bVar15 & 1) != 0) {
                    if ((((data->set).field_0x89f & 0x40) == 0) ||
                       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 &&
                        (pcVar7->log_level < 1)))) goto LAB_0015e9d7;
                    pcVar22 = "Waiting on connection to negotiate possible multiplexing.";
LAB_0015e9cd:
                    Curl_infof(data,pcVar22);
LAB_0015e9d7:
                    Curl_conn_free(data,conn);
                    return CURLE_NO_CONNECTION_AVAILABLE;
                  }
                  iVar17 = Curl_cpool_check_limits(data,conn);
                  if (iVar17 == 2) {
                    uVar19 = (uint)*(undefined8 *)&(data->set).field_0x89c;
                    if (data->master_mid == 0xffffffff) {
                      if (((uVar19 >> 0x1e & 1) != 0) &&
                         ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                          (0 < pcVar7->log_level)))) {
                        Curl_infof(data,"No connections available, total of %ld reached.",
                                   data->multi->max_total_connections);
                      }
                      goto LAB_0015e9d7;
                    }
                    if (((uVar19 >> 0x1e & 1) != 0) &&
                       (((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                         (0 < pcVar7->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
                      Curl_trc_multi(data,
                                     "Allowing sub-requests (like DoH) to override max connection limit"
                                    );
                    }
                  }
                  else if (iVar17 == 1) {
                    if ((((data->set).field_0x89f & 0x40) == 0) ||
                       ((pcVar7 = (data->state).feat, pcVar7 != (curl_trc_feat *)0x0 &&
                        (pcVar7->log_level < 1)))) goto LAB_0015e9d7;
                    pcVar22 = "No more connections allowed to host";
                    goto LAB_0015e9cd;
                  }
                  CVar18 = Curl_ssl_conn_config_init(data,conn);
                  if (CVar18 == CURLE_OK) {
                    Curl_attach_connection(data,conn);
                    CVar18 = Curl_cpool_add(data,conn);
                    if (CVar18 == CURLE_OK) {
                      if ((((data->state).authhost.picked & 8) != 0) &&
                         (bVar15 = (data->state).authhost.field_0x18, (bVar15 & 1) != 0)) {
                        if ((((data->set).field_0x89f & 0x40) != 0) &&
                           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                            (0 < pcVar7->log_level)))) {
                          Curl_infof(data,"NTLM picked AND auth done set, clear picked");
                          bVar15 = (data->state).authhost.field_0x18;
                        }
                        (data->state).authhost.picked = 0;
                        (data->state).authhost.field_0x18 = bVar15 & 0xfe;
                      }
                      conn_00 = conn;
                      if ((((data->state).authproxy.picked & 8) != 0) &&
                         (bVar15 = (data->state).authproxy.field_0x18, (bVar15 & 1) != 0)) {
                        if ((((data->set).field_0x89f & 0x40) != 0) &&
                           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                            (0 < pcVar7->log_level)))) {
                          Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked");
                          bVar15 = (data->state).authproxy.field_0x18;
                        }
                        (data->state).authproxy.picked = 0;
                        (data->state).authproxy.field_0x18 = bVar15 & 0xfe;
                      }
                      goto LAB_0015e918;
                    }
                  }
                }
              }
              else {
                (data->info).conn_scheme = pCVar26->scheme;
                (data->info).conn_protocol = pCVar26->protocol & 0x3ffffff;
                CVar18 = (*pCVar26->connect_it)(data,(_Bool *)&newurl);
                if (CVar18 == CURLE_OK) {
                  Curl_attach_connection(data,conn);
                  CVar18 = Curl_cpool_add(data,conn);
                  if ((CVar18 == CURLE_OK) && (CVar18 = setup_range(data), CVar18 == CURLE_OK)) {
                    Curl_xfer_setup_nop(data);
                    CVar18 = Curl_init_do(data,conn);
                    if (CVar18 == CURLE_OK) {
                      CVar18 = CURLE_OK;
                      goto LAB_0015e5a3;
                    }
                  }
                  (*conn->handler->done)(data,CVar18,false);
                }
LAB_0015e5a3:
                if (CVar18 == CURLE_OK) {
                  uVar19 = Curl_uint_spbset_count(&conn->xfers_attached);
                  if (1 < uVar19) {
                    *local_40 = true;
                    return CURLE_OK;
                  }
                  if (*local_60 != false) {
                    return CURLE_OK;
                  }
                  CVar18 = Curl_setup_conn(data,local_40);
                }
              }
LAB_0015ccc1:
              CVar20 = CVar18;
              if (CVar18 == CURLE_NO_CONNECTION_AVAILABLE) {
                return CURLE_NO_CONNECTION_AVAILABLE;
              }
              goto switchD_0015cad1_caseD_5;
            default:
              goto switchD_0015cf66_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0015cad1_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              break;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0015cad1_caseD_8;
            }
          default:
            if (CVar16 != CURLUE_OK) goto switchD_0015cf66_caseD_1;
            pcVar22 = (*Curl_cstrdup)(*ppcVar4);
            conn->options = pcVar22;
            if (pcVar22 != (char *)0x0) goto switchD_0015cff8_caseD_d;
          }
          goto switchD_0015cad1_caseD_7;
        }
      }
      pcVar38 = " (in redirect)";
      if (((data->state).field_0x7be & 8) == 0) {
        pcVar38 = "";
      }
      Curl_failf(data,"Protocol \"%s\" %s%s",pcVar22,pcVar41,pcVar38);
      goto switchD_0015cad1_caseD_5;
    }
    iVar17 = curl_strequal("file",part->scheme);
    if (iVar17 != 0) {
      pcVar22 = *ppcVar1;
      goto LAB_0015cc3b;
    }
switchD_0015cad1_caseD_7:
    CVar20 = CURLE_OUT_OF_MEMORY;
switchD_0015cad1_caseD_5:
    if ((CVar20 != CURLE_OK) && (conn != (connectdata *)0x0)) {
      Curl_detach_connection(data);
      Curl_conn_terminate(data,conn,true);
    }
    return CVar20;
  default:
    goto switchD_0015cad1_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
    goto switchD_0015cad1_caseD_5;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0015cad1_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0015cad1_caseD_8:
    CVar20 = CURLE_LOGIN_DENIED;
    goto switchD_0015cad1_caseD_5;
  }
LAB_0015ddb2:
  bVar15 = *__s;
  if (bVar15 == 0) goto LAB_0015ddfb;
  if ((((9 < (byte)(bVar15 - 0x30)) && (0x19 < (byte)((bVar15 & 0xdf) + 0xbf))) &&
      (1 < bVar15 - 0x2d)) && ((bVar15 != 0x7e && (bVar15 != 0x5f)))) goto LAB_0015ddee;
  __s = __s + 1;
  goto LAB_0015ddb2;
LAB_0015ddee:
  if (bVar15 == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
LAB_0015ddfb:
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Invalid IPv6 address format");
    }
  }
LAB_0015de27:
  pcVar22 = strchr((char *)__s,0x3a);
  uVar19 = 0xffffffff;
  if ((pcVar22 == (char *)0x0) || (*pcVar22 = '\0', pcVar22[1] == '\0')) {
LAB_0015de91:
    pcVar22 = (*Curl_cstrdup)((char *)pbVar39);
    CVar18 = CURLE_OK;
    if (pcVar22 == (char *)0x0) {
      CVar18 = CURLE_OUT_OF_MEMORY;
      goto LAB_0015debe;
    }
    bVar43 = true;
  }
  else {
    local_38 = pcVar22 + 1;
    iVar17 = Curl_str_number(&local_38,(curl_off_t *)&newurl,0xffff);
    if (iVar17 == 0) {
      uVar19 = (uint)newurl;
      goto LAB_0015de91;
    }
    Curl_failf(data,"No valid port number in connect to host string (%s)",pcVar22 + 1);
    CVar18 = CURLE_SETOPT_OPTION_SYNTAX;
LAB_0015debe:
    uVar19 = 0xffffffff;
    pcVar22 = (char *)0x0;
    bVar43 = false;
  }
  (*Curl_cfree)(pbVar28);
  if (!bVar43) goto LAB_0015e5a3;
  if (pcVar22 == (char *)0x0) {
    pcVar22 = (char *)0x0;
  }
  else if (*pcVar22 != '\0') {
    (conn->conn_to_host).rawalloc = pcVar22;
    (conn->conn_to_host).name = pcVar22;
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 | 1;
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Connecting to hostname: %s",pcVar22);
    }
    goto LAB_0015dd0b;
  }
LAB_0015dcf4:
  puVar2 = &(conn->bits).field_0x1;
  *puVar2 = *puVar2 & 0xfe;
  (*Curl_cfree)(pcVar22);
  pcVar22 = (char *)0x0;
LAB_0015dd0b:
  if ((int)uVar19 < 0) {
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 & 0xfd;
    uVar19 = 0xffffffff;
  }
  else {
    conn->conn_to_port = uVar19;
    puVar2 = &(conn->bits).field_0x1;
    *puVar2 = *puVar2 | 2;
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level)))) {
      Curl_infof(data,"Connecting to port: %d",(ulong)uVar19);
    }
  }
  local_b8 = &pcVar6->next;
  goto LAB_0015db4c;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* Set the request to virgin state based on transfer settings */
  Curl_req_hard_reset(&data->req, data);

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_ATTACHED(conn) > 1)
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that is either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(data, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We are not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_detach_connection(data);
    Curl_conn_terminate(data, conn, TRUE);
  }

  return result;
}